

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::ListColumnWriter::ListColumnWriter
          (ListColumnWriter *this,ParquetWriter *writer,ParquetColumnSchema *column_schema,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *schema_path_p,
          unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
          *child_writer_p,bool can_have_nulls)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  pbVar1 = (schema_path_p->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar2 = (schema_path_p->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (schema_path_p->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (schema_path_p->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (schema_path_p->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (schema_path_p->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ColumnWriter)._vptr_ColumnWriter = (_func_int **)&PTR__ColumnWriter_027d3838;
  (this->super_ColumnWriter).writer = writer;
  (this->super_ColumnWriter).column_schema = column_schema;
  (this->super_ColumnWriter).schema_path.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar2;
  (this->super_ColumnWriter).schema_path.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  (this->super_ColumnWriter).schema_path.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar1;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  (this->super_ColumnWriter).can_have_nulls = can_have_nulls;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_28);
  (this->super_ColumnWriter)._vptr_ColumnWriter = (_func_int **)&PTR__ListColumnWriter_027d6bf0;
  (this->child_writer).
  super_unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>.
  super__Head_base<0UL,_duckdb::ColumnWriter_*,_false>._M_head_impl =
       (child_writer_p->
       super_unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>)._M_t.
       super___uniq_ptr_impl<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>.
       super__Head_base<0UL,_duckdb::ColumnWriter_*,_false>._M_head_impl;
  (child_writer_p->
  super_unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>.
  super__Head_base<0UL,_duckdb::ColumnWriter_*,_false>._M_head_impl = (ColumnWriter *)0x0;
  return;
}

Assistant:

ListColumnWriter(ParquetWriter &writer, const ParquetColumnSchema &column_schema, vector<string> schema_path_p,
	                 unique_ptr<ColumnWriter> child_writer_p, bool can_have_nulls)
	    : ColumnWriter(writer, column_schema, std::move(schema_path_p), can_have_nulls),
	      child_writer(std::move(child_writer_p)) {
	}